

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret.cpp
# Opt level: O1

void __thiscall
duckdb::KeyValueSecretReader::ThrowNotFoundError(KeyValueSecretReader *this,string *secret_key)

{
  pointer pcVar1;
  KeyValueSecret *pKVar2;
  long *plVar3;
  InvalidConfigurationException *pIVar4;
  long *plVar5;
  string secret_scope;
  string secret_scope_hint_message;
  string base_message;
  string local_150;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  undefined1 *local_110;
  long local_108;
  undefined1 local_100 [16];
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_110 = local_100;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_110,"Failed to fetch required secret key \'%s\' from secret","");
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  if ((this->secret).ptr == (KeyValueSecret *)0x0) {
    pcVar1 = (this->path)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_150,pcVar1,pcVar1 + (this->path)._M_string_length);
    if (local_150._M_string_length == 0) {
      local_130 = &local_120;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,".","");
    }
    else {
      ::std::operator+(&local_50," for \'",&local_150);
      plVar3 = (long *)::std::__cxx11::string::append((char *)&local_50);
      local_130 = (long *)*plVar3;
      plVar5 = plVar3 + 2;
      if (local_130 == plVar5) {
        local_120 = *plVar5;
        lStack_118 = plVar3[3];
        local_130 = &local_120;
      }
      else {
        local_120 = *plVar5;
      }
      local_128 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
    }
    if ((local_150._M_string_length != 0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2)) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    pIVar4 = (InvalidConfigurationException *)__cxa_allocate_exception(0x10);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    ::std::__cxx11::string::_M_construct<char*>((string *)&local_f0,local_110,local_110 + local_108)
    ;
    ::std::__cxx11::string::append((char *)&local_f0);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    pcVar1 = (secret_key->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar1,pcVar1 + secret_key->_M_string_length);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,local_130,local_128 + (long)local_130);
    InvalidConfigurationException::
    InvalidConfigurationException<std::__cxx11::string,std::__cxx11::string>
              (pIVar4,&local_f0,&local_90,&local_b0);
    __cxa_throw(pIVar4,&InvalidConfigurationException::typeinfo,::std::runtime_error::~runtime_error
               );
  }
  pIVar4 = (InvalidConfigurationException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::_M_construct<char*>((string *)&local_150,local_110,local_110 + local_108);
  ::std::__cxx11::string::append((char *)&local_150);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  pcVar1 = (secret_key->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar1,pcVar1 + secret_key->_M_string_length);
  optional_ptr<const_duckdb::KeyValueSecret,_true>::CheckValid(&this->secret);
  pKVar2 = (this->secret).ptr;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar1 = (pKVar2->super_BaseSecret).name._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + (pKVar2->super_BaseSecret).name._M_string_length);
  InvalidConfigurationException::
  InvalidConfigurationException<std::__cxx11::string,std::__cxx11::string>
            (pIVar4,&local_150,&local_d0,&local_70);
  __cxa_throw(pIVar4,&InvalidConfigurationException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void KeyValueSecretReader::ThrowNotFoundError(const string &secret_key) {
	string base_message = "Failed to fetch required secret key '%s' from secret";

	if (!secret) {
		string secret_scope = path;
		string secret_scope_hint_message = secret_scope.empty() ? "." : " for '" + secret_scope + "'.";
		throw InvalidConfigurationException(base_message + ", because no secret was found%s", secret_key,
		                                    secret_scope_hint_message);
	}

	throw InvalidConfigurationException(base_message + " '%s'.", secret_key, secret->GetName());
}